

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateCatIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Con)

{
  int *piVar1;
  Cba_Man_t *pCVar2;
  uint i;
  uint uVar3;
  int iVar4;
  int Fill;
  int Fill_00;
  int Fill_01;
  long lVar5;
  int iVar6;
  
  if ((-1 < Con) && (iVar6 = (pNtk->vConcats).nSize, Con < iVar6)) {
    piVar1 = (pNtk->vConcats).pArray;
    Prs_CatSignals_V_1 = piVar1[(uint)Con];
    if (iVar6 <= (int)(Con + 1U)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    Prs_CatSignals_V_2 = piVar1 + (Con + 1U);
    i = Cba_ObjAlloc(p,CBA_BOX_CONCAT,Prs_CatSignals_V_1,1);
    if ((int)i < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
    }
    if ((int)i < (p->vObjFon0).nSize) {
      iVar6 = (p->vObjFon0).pArray[i];
      uVar3 = Cba_NtkNewStrId(p,"_icc%d_",(ulong)i);
      Cba_FonSetName(p,iVar6,uVar3);
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar3 + 1,Fill);
      if ((-1 < (int)uVar3) && ((int)uVar3 < (pCVar2->vNameMap).nSize)) {
        if ((pCVar2->vNameMap).pArray[uVar3] != 0) {
          __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
        }
        Vec_IntFillExtra(&pCVar2->vNameMap,uVar3 + 1,Fill_00);
        if ((pCVar2->vNameMap).nSize <= (int)uVar3) {
LAB_003b8d46:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pCVar2->vNameMap).pArray[uVar3] = iVar6;
        Vec_IntPush(&pCVar2->vUsed,uVar3);
        if (Prs_CatSignals_V_1 < 1) {
          iVar6 = -1;
        }
        else {
          lVar5 = 0;
          iVar6 = 0;
          do {
            iVar4 = Prs_CreateSignalIn(p,pNtk,Prs_CatSignals_V_2[lVar5]);
            if (iVar4 != 0) {
              Cba_ObjSetFinFon(p,i,(int)lVar5,iVar4);
              iVar4 = Cba_FonRangeSize(p,iVar4);
              iVar6 = iVar6 + iVar4;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < Prs_CatSignals_V_1);
          iVar6 = iVar6 + -1;
        }
        if ((int)i < (p->vObjFon0).nSize) {
          piVar1 = (p->vObjFon0).pArray;
          uVar3 = piVar1[i];
          iVar6 = Hash_Int2ManInsert(p->pDesign->vHash,iVar6,0,(int)piVar1);
          if ((p->vFonRange).nSize < 1) {
            __assert_fail("Cba_NtkHasFonRanges(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                          ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
          }
          if (iVar6 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntFillExtra(&p->vFonRange,uVar3 + 1,Fill_01);
          if (((int)uVar3 < 0) || ((p->vFonRange).nSize <= (int)uVar3)) goto LAB_003b8d46;
          (p->vFonRange).pArray[uVar3] = iVar6 * 2;
          if ((int)i < (p->vObjFon0).nSize) {
            return (p->vObjFon0).pArray[i];
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateCatIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Con )
{
    extern int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig );
    int i, Sig, iObj, iFon, NameId, nBits = 0;
    Vec_Int_t * vSigs = Prs_CatSignals(pNtk, Con);
    // create input concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, Vec_IntSize(vSigs), 1 );
    iFon = Cba_ObjFon0(p, iObj);
    //sprintf( Buffer, "_icc%d_", iObj );
    //NameId = Cba_NtkNewStrId( p, Buffer );
    NameId = Cba_NtkNewStrId( p, "_icc%d_", iObj );
    Cba_FonSetName( p, iFon, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    // set inputs
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        iFon = Prs_CreateSignalIn( p, pNtk, Sig );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, i, iFon );
        if ( iFon )
            nBits += Cba_FonRangeSize( p, iFon );
    }
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, nBits-1, 0) );
    return Cba_ObjFon0(p, iObj);
}